

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

bool StringFormatter<unsigned_long_&,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
     output_int<unsigned_long>(ostream *os,unsigned_long value)

{
  unsigned_long value_local;
  ostream *os_local;
  
  std::ostream::operator<<(os,value);
  return true;
}

Assistant:

static bool output_int(std::ostream& os, T value)
    {
        if constexpr ((std::is_integral_v<T> && sizeof(T) == 1) || std::is_same_v<T, wchar_t>) {
            os << (unsigned long)value;
            return true;
        }
        else if constexpr (std::is_integral_v<T> || std::is_floating_point_v<T>) {
            os << value;
            return true;
        }

        return false;
    }